

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::
small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
::switch_to_big(small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
                *this,size_t new_elements)

{
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  array<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
  *paVar1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *__x;
  ulong uVar2;
  
  this_00 = &this->big_buffer_;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_M_erase_at_end(this_00,(this->big_buffer_).
                            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::reserve(this_00,new_elements);
  if (0 < (long)this->elements_) {
    __x = this->buffer_;
    uVar2 = this->elements_ + 1;
    do {
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::push_back(this_00,__x);
      __x = __x + 1;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  if (new_elements < 2) {
    paVar1 = &this->small_buffer_;
  }
  else {
    paVar1 = (array<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>
              *)(this->big_buffer_).
                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  }
  this->buffer_ = paVar1->_M_elems;
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }